

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall
level_tools::calculate_subdivisions
          (level_tools *this,size_t *vb_size,size_t *ib_size,uint32_t ogf_idx)

{
  value_type pxVar1;
  uint32_t *puVar2;
  bool bVar3;
  int iVar4;
  uint32_t eshader_idx;
  const_reference ppxVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *puVar6;
  
  ppxVar5 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                      (this->m_subdivisions,(ulong)ogf_idx);
  pxVar1 = *ppxVar5;
  iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])
                    (pxVar1);
  if ((char)iVar4 == '\0') {
    eshader_idx = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x1e])(pxVar1);
    bVar3 = is_compiled_wallmark(this,eshader_idx);
    if (!bVar3) {
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        (pxVar1);
      *vb_size = *vb_size + *(long *)(CONCAT44(extraout_var,iVar4) + 0x10);
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        (pxVar1);
      *ib_size = *ib_size + *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x10);
    }
  }
  else {
    puVar2 = (pxVar1->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (pxVar1->m_children_l).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      calculate_subdivisions(this,vb_size,ib_size,*puVar6);
    }
  }
  return;
}

Assistant:

void level_tools::calculate_subdivisions(size_t& vb_size, size_t& ib_size, uint32_t ogf_idx) const
{
	const xr_ogf* ogf = m_subdivisions->at(ogf_idx);
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			calculate_subdivisions(vb_size, ib_size, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		// FIXME: this might be useful to restore wallmarks
		// even if there is no redundant level.wallmarks
	} else {
		vb_size += ogf->vb().size();
		ib_size += ogf->ib().size();
	}
}